

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O3

void kj::anon_unknown_0::captureSignals(void)

{
  int signum;
  
  if ((anonymous_namespace)::captureSignals()::captured == '\0') {
    UnixEventPort::captureSignal(0x17);
    UnixEventPort::captureSignal(0x1d);
    signum = __libc_current_sigrtmin();
    UnixEventPort::captureSignal(signum);
    UnixEventPort::captureChildExit();
    (anonymous_namespace)::captureSignals()::captured = '\x01';
  }
  return;
}

Assistant:

void captureSignals() {
  static bool captured = false;
  if (!captured) {
    // We use SIGIO and SIGURG as our test signals because they're two signals that we can be
    // reasonably confident won't otherwise be delivered to any KJ or Cap'n Proto test.  We can't
    // use SIGUSR1 because it is reserved by UnixEventPort and SIGUSR2 is used by Valgrind on OSX.
    UnixEventPort::captureSignal(SIGURG);
    UnixEventPort::captureSignal(SIGIO);

#ifdef SIGRTMIN
    UnixEventPort::captureSignal(SIGRTMIN);
#endif

    UnixEventPort::captureChildExit();

    captured = true;
  }
}